

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  size_type __n;
  char *filename;
  char *pcVar4;
  bool bVar5;
  allocator<char> local_251;
  string input_text;
  vector<unsigned_long,_std::allocator<unsigned_long>_> binary;
  ofstream outfp;
  
  iVar3 = 1;
  pcVar4 = (char *)0x0;
  filename = (char *)0x0;
  do {
    if (argc <= iVar3) {
      if (filename == (char *)0x0) {
        pcVar4 = "no input file";
      }
      else {
        if (pcVar4 != (char *)0x0) {
          std::ifstream::ifstream(&outfp,filename,_S_bin);
          cVar2 = std::__basic_file<char>::is_open();
          if (cVar2 == '\0') {
            fatal_error((char *)0x0,"%s: failed to open",filename);
          }
          std::istream::seekg((long)&outfp,_S_beg);
          __n = std::istream::tellg();
          input_text._M_dataplus._M_p = (pointer)&input_text.field_2;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct(&input_text,__n,' ');
          std::istream::seekg((long)&outfp,_S_beg);
          std::istream::read((char *)&outfp,(long)input_text._M_dataplus._M_p);
          std::ifstream::~ifstream(&outfp);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&outfp,input_text._M_dataplus._M_p,&local_251);
          nxas::assemble(&binary,(string *)&outfp,filename);
          std::__cxx11::string::~string((string *)&outfp);
          std::ofstream::ofstream(&outfp,pcVar4,_S_bin);
          cVar2 = std::__basic_file<char>::is_open();
          if (cVar2 != '\0') {
            std::ostream::write((char *)&outfp,
                                (long)binary.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
            std::ofstream::~ofstream(&outfp);
            std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                      (&binary.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
            std::__cxx11::string::~string((string *)&input_text);
            return 0;
          }
          fatal_error("%s: failed to open",pcVar4);
        }
        pcVar4 = "no output file";
      }
LAB_0011d04c:
      fatal_error(pcVar4);
    }
    pcVar1 = argv[iVar3];
    if (((*pcVar1 == '-') && (pcVar1[1] == 'o')) && (pcVar1[2] == '\0')) {
      if (pcVar4 != (char *)0x0) {
        pcVar4 = "command line output file already provided";
        goto LAB_0011d04c;
      }
      iVar3 = iVar3 + 1;
      if (iVar3 == argc) {
        pcVar4 = "expected command line syntax: \"-o\" <output file>";
        goto LAB_0011d04c;
      }
      pcVar4 = argv[iVar3];
    }
    else {
      bVar5 = filename != (char *)0x0;
      filename = pcVar1;
      if (bVar5) {
        pcVar4 = "command line input file already provided";
        goto LAB_0011d04c;
      }
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

int main(int argc, char** argv)
{
    const char* input_file = nullptr;
    const char* output_file = nullptr;

    for (int i = 1; i < argc; ++i) {
        // Parse output file
        if (std::strcmp(argv[i], "-o") == 0) {
            if (output_file) {
                fatal_error("command line output file already provided");
            }
            if (++i == argc) {
                fatal_error("expected command line syntax: \"-o\" <output file>");
            }
            output_file = argv[i];
            continue;
        }
        // There's no modifier, it's an input file
        if (input_file) {
            fatal_error("command line input file already provided");
        }
        input_file = argv[i];
    }
    if (!input_file) {
        fatal_error("no input file");
    }
    if (!output_file) {
        fatal_error("no output file");
    }
    const std::string input_text = read_file(input_file);
    const std::vector<uint64_t> binary = nxas::assemble(input_text.c_str(), input_file);
    try {
        std::ofstream outfp(output_file, std::ios::binary);
        if (!outfp.is_open()) {
            fatal_error("%s: failed to open", output_file);
        }
        outfp.write(reinterpret_cast<const char*>(binary.data()), binary.size() * sizeof(uint64_t));
    } catch (const std::ios_base::failure& e) {
        fatal_error("failed to write output file: %s", e.what());
    }
}